

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb_queue.c
# Opt level: O1

_Bool uo_cb_queue_init(void)

{
  undefined1 uVar1;
  int iVar2;
  
  uVar1 = 1;
  if (!is_init) {
    is_init = true;
    iVar2 = sem_init((sem_t *)&cb_queue,0,0);
    is_init = (_Bool)(is_init & iVar2 == 0);
    iVar2 = sem_init((sem_t *)&cb_queue.enqueue_sem,0,0x100);
    is_init = (_Bool)(is_init & iVar2 == 0);
    cb_queue.head = 0;
    cb_queue.tail = 0;
    atexit(uo_cb_queue_quit);
    uVar1 = is_init;
  }
  return (_Bool)uVar1;
}

Assistant:

bool uo_cb_queue_init()
{
    if (is_init)
        return true;

    is_init = true;

    is_init &= sem_init(&cb_queue.dequeue_sem, 0, 0) == 0;
    is_init &= sem_init(&cb_queue.enqueue_sem, 0, UO_CB_QUEUE_CAPACITY) == 0;

    atomic_init(&cb_queue.head, 0);
    atomic_init(&cb_queue.tail, 0);

    atexit(uo_cb_queue_quit);

    return is_init;
}